

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::SGXMLScanner::normalizeAttValue
          (SGXMLScanner *this,XMLAttDef *attDef,XMLCh *attName,XMLCh *value,XMLBuffer *toFill)

{
  XMLByte XVar1;
  AttTypes AVar2;
  XMLByte *pXVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLCh XVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte local_41;
  
  if (attDef == (XMLAttDef *)0x0) {
    toFill->fIndex = 0;
    local_41 = 1;
  }
  else {
    AVar2 = attDef->fType;
    toFill->fIndex = 0;
    local_41 = attDef->fExternalAttribute ^ 1U | (uint)(AVar2 + ~NmTokens) < 0xfffffff9;
    if (AVar2 < Enumeration && AVar2 != AttTypes_Min) {
      bVar8 = true;
      bVar9 = false;
      do {
        bVar10 = false;
        while( true ) {
          while( true ) {
            XVar6 = *value;
            uVar7 = (ulong)(ushort)XVar6;
            if (XVar6 == L'<') {
              bVar8 = false;
              XMLScanner::emitError
                        (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0);
              uVar7 = 0x3c;
            }
            else if (XVar6 == L'\xffff') {
              uVar7 = (ulong)(ushort)value[1];
              value = value + 1;
            }
            else if (XVar6 == L'\0') {
              return bVar8;
            }
            pXVar3 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable;
            XVar1 = pXVar3[uVar7];
            if (!bVar10) break;
            if (-1 < (char)XVar1) {
              XVar5 = toFill->fIndex;
              if (bVar9) {
                XVar4 = XVar5;
                if (XVar5 == toFill->fCapacity) {
                  XMLBuffer::ensureCapacity(toFill,1);
                  XVar4 = toFill->fIndex;
                }
                XVar5 = XVar4 + 1;
                toFill->fIndex = XVar5;
                toFill->fBuffer[XVar4] = L' ';
              }
              goto LAB_002b3642;
            }
            value = value + 1;
            bVar10 = true;
          }
          if (-1 < (char)XVar1) break;
          value = value + 1;
          bVar10 = true;
          if ((((this->super_XMLScanner).fStandalone == true) &&
              ((this->super_XMLScanner).fValidate == true && local_41 == 0)) &&
             ((!bVar9 ||
              ((((XMLCh)uVar7 != L' ' && ((ulong)(ushort)*value != 0)) &&
               ((char)pXVar3[(ushort)*value] < '\0')))))) {
            XMLValidator::emitError
                      ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,
                       (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        XVar5 = toFill->fIndex;
LAB_002b3642:
        if (XVar5 == toFill->fCapacity) {
          XMLBuffer::ensureCapacity(toFill,1);
          XVar5 = toFill->fIndex;
        }
        toFill->fIndex = XVar5 + 1;
        toFill->fBuffer[XVar5] = (XMLCh)uVar7;
        value = value + 1;
        bVar9 = true;
      } while( true );
    }
  }
  bVar9 = true;
  do {
    XVar6 = *value;
    if (XVar6 == L'\xffff') {
      XVar6 = value[1];
      value = value + 1;
    }
    else {
      if (XVar6 == L'\0') {
        return bVar9;
      }
      if ((ushort)XVar6 < 0xe) {
        if ((((ushort)XVar6 < 0xe) && ((0x2600U >> ((ushort)XVar6 & 0x1f) & 1) != 0)) &&
           ((XVar6 = L' ', (this->super_XMLScanner).fStandalone == true &&
            ((this->super_XMLScanner).fValidate == true && local_41 == 0)))) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0
                     ,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else if (XVar6 == L'<') {
        bVar9 = false;
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        XVar6 = L'<';
      }
    }
    XVar5 = toFill->fIndex;
    if (XVar5 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
      XVar5 = toFill->fIndex;
    }
    toFill->fIndex = XVar5 + 1;
    toFill->fBuffer[XVar5] = XVar6;
    value = value + 1;
  } while( true );
}

Assistant:

bool SGXMLScanner::normalizeAttValue( const   XMLAttDef* const    attDef
                                      , const XMLCh* const        attName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // A simple state value for a whitespace processing state machine
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                            ?attDef->getType()
                            :XMLAttDef::CData;

    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    States curState = InContent;
    bool firstNonWS = false;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;

    if (type == XMLAttDef::CData || type > XMLAttDef::Notation) {
        while (*srcPtr) {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if ( (nextCh <= 0x0D) && (nextCh == 0x09 || nextCh == 0x0A || nextCh == 0x0D) ) {
                // Check Validity Constraint for Standalone document declaration
                // XML 1.0, Section 2.9
                if (fStandalone && fValidate && isAttTokenizedExternal)
                {
                     // Can't have a standalone document declaration of "yes" if  attribute
                     // values are subject to normalisation
                     fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                }
                nextCh = chSpace;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }
    else {
        while (*srcPtr)
        {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            if (curState == InWhitespace)
            {
                if (!fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    if (firstNonWS)
                        toFill.append(chSpace);
                    curState = InContent;
                    firstNonWS = true;
                }
                else
                {
                    srcPtr++;
                    continue;
                }
            }
            else if (curState == InContent)
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    curState = InWhitespace;
                    srcPtr++;

                    // Check Validity Constraint for Standalone document declaration
                    // XML 1.0, Section 2.9
                    if (fStandalone && fValidate && isAttTokenizedExternal)
                    {
                        if (!firstNonWS || (nextCh != chSpace && *srcPtr && fReaderMgr.getCurrentReader()->isWhitespace(*srcPtr)))
                        {
                            // Can't have a standalone document declaration of "yes" if  attribute
                            // values are subject to normalisation
                            fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                        }
                    }
                    continue;
                }
                firstNonWS = true;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }

    return retVal;
}